

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WuQuantizer.cpp
# Opt level: O1

void __thiscall
HACD::MyWuQuantizer::normalizeInput(MyWuQuantizer *this,HaU32 vcount,HaF32 *vertices)

{
  float fVar1;
  Vec3 *pVVar2;
  float fVar3;
  float fVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  HaF32 HVar14;
  HaF32 HVar15;
  HaF32 HVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  
  (this->mNormalizedInput).mSize = 0;
  (this->mQuantizedOutput).mSize = 0;
  HVar15 = *vertices;
  HVar16 = vertices[1];
  HVar14 = vertices[2];
  fVar11 = (float)HVar15;
  fVar12 = (float)HVar16;
  fVar13 = (float)HVar14;
  if (1 < vcount) {
    uVar9 = 3;
    do {
      uVar8 = uVar9 & 0xffffffff;
      fVar1 = (float)vertices[uVar8];
      fVar3 = fVar1;
      if (((float)HVar15 <= fVar1) && (fVar3 = (float)HVar15, fVar11 < fVar1)) {
        fVar11 = fVar1;
      }
      HVar15 = (HaF32)fVar3;
      fVar1 = (float)vertices[uVar8 + 1];
      fVar3 = fVar1;
      if (((float)HVar16 <= fVar1) && (fVar3 = (float)HVar16, fVar12 < fVar1)) {
        fVar12 = fVar1;
      }
      HVar16 = (HaF32)fVar3;
      fVar1 = (float)vertices[uVar8 + 2];
      fVar3 = fVar1;
      if (((float)HVar14 <= fVar1) && (fVar3 = (float)HVar14, fVar13 < fVar1)) {
        fVar13 = fVar1;
      }
      HVar14 = (HaF32)fVar3;
      uVar9 = uVar9 + 3;
    } while ((ulong)vcount * 3 != uVar9);
  }
  (this->mCenter).x = (HaF32)((fVar11 + (float)HVar15) * 0.5);
  (this->mCenter).y = (HaF32)((fVar12 + (float)HVar16) * 0.5);
  (this->mCenter).z = (HaF32)((fVar13 + (float)HVar14) * 0.5);
  auVar19 = ZEXT816(0) << 0x40;
  uVar5 = vcmpss_avx512f(ZEXT416((uint)(fVar11 - (float)HVar15)),auVar19,0);
  bVar6 = (bool)((byte)uVar5 & 1);
  fVar11 = (float)((uint)bVar6 * 0x3f800000 +
                  (uint)!bVar6 * (int)((fVar11 - (float)HVar15) * 1.001 * 0.5));
  (this->mScale).x = (HaF32)fVar11;
  uVar5 = vcmpss_avx512f(ZEXT416((uint)(fVar12 - (float)HVar16)),auVar19,0);
  bVar6 = (bool)((byte)uVar5 & 1);
  fVar12 = (float)((uint)bVar6 * 0x3f800000 +
                  (uint)!bVar6 * (int)((fVar12 - (float)HVar16) * 1.001 * 0.5));
  (this->mScale).y = (HaF32)fVar12;
  uVar5 = vcmpss_avx512f(ZEXT416((uint)(fVar13 - (float)HVar14)),auVar19,0);
  bVar6 = (bool)((byte)uVar5 & 1);
  fVar13 = (float)((uint)bVar6 * 0x3f800000 +
                  (uint)!bVar6 * (int)((fVar13 - (float)HVar14) * 1.001 * 0.5));
  (this->mScale).z = (HaF32)fVar13;
  if (vcount != 0) {
    uVar9 = 0;
    auVar18 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    do {
      uVar8 = uVar9 & 0xffffffff;
      fVar1 = (1.0 / fVar11) * ((float)vertices[uVar8] - (float)(this->mCenter).x);
      auVar17 = auVar18._0_16_;
      auVar19 = vandps_avx(ZEXT416((uint)fVar1),auVar17);
      if (1.0 < auVar19._0_4_) {
        __assert_fail("v.x >= -1 && v.x <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                      ,0x3ef,"void HACD::MyWuQuantizer::normalizeInput(HaU32, const HaF32 *)");
      }
      fVar3 = (1.0 / fVar12) * ((float)vertices[uVar8 + 1] - (float)(this->mCenter).y);
      auVar19 = vandps_avx(ZEXT416((uint)fVar3),auVar17);
      if (1.0 < auVar19._0_4_) {
        __assert_fail("v.y >= -1 && v.y <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                      ,0x3f0,"void HACD::MyWuQuantizer::normalizeInput(HaU32, const HaF32 *)");
      }
      fVar4 = (1.0 / fVar13) * ((float)vertices[uVar8 + 2] - (float)(this->mCenter).z);
      auVar19 = vandps_avx(ZEXT416((uint)fVar4),auVar17);
      if (1.0 < auVar19._0_4_) {
        __assert_fail("v.z >= -1 && v.z <= 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/WuQuantizer.cpp"
                      ,0x3f1,"void HACD::MyWuQuantizer::normalizeInput(HaU32, const HaF32 *)");
      }
      uVar10 = (this->mNormalizedInput).mCapacity;
      uVar7 = uVar10 & 0x7fffffff;
      if (uVar7 <= (this->mNormalizedInput).mSize) {
        uVar10 = uVar10 * 2;
        if (uVar7 == 0) {
          uVar10 = 1;
        }
        if (uVar10 <= uVar7) {
          __assert_fail("this->capacity() < capacity",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/PxVector.h"
                        ,0x208,"void hacd::vector<HACD::Vec3>::grow(HaU32) [T = HACD::Vec3]");
        }
        hacd::vector<HACD::Vec3>::recreate(&this->mNormalizedInput,uVar10);
        auVar18 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
      }
      pVVar2 = (this->mNormalizedInput).mData;
      uVar10 = (this->mNormalizedInput).mSize;
      pVVar2[uVar10].x = (HaF32)fVar1;
      pVVar2[uVar10].y = (HaF32)fVar3;
      pVVar2[uVar10].z = (HaF32)fVar4;
      (this->mNormalizedInput).mSize = uVar10 + 1;
      uVar9 = uVar9 + 3;
    } while ((ulong)vcount * 3 != uVar9);
  }
  return;
}

Assistant:

void normalizeInput(HaU32 vcount,const HaF32 *vertices)
	{
		mNormalizedInput.clear();
		mQuantizedOutput.clear();
		Vec3 bmin(vertices);
		Vec3 bmax(vertices);
		for (HaU32 i=1; i<vcount; i++)
		{
			Vec3 v(&vertices[i*3]);

			if ( v.x < bmin.x ) 
			{
				bmin.x = v.x;
			}
			else if ( v.x > bmax.x )
			{
				bmax.x = v.x;
			}

			if ( v.y < bmin.y ) 
			{
				bmin.y = v.y;
			}
			else if ( v.y > bmax.y )
			{
				bmax.y = v.y;
			}

			if ( v.z < bmin.z ) 
			{
				bmin.z = v.z;
			}
			else if ( v.z > bmax.z )
			{
				bmax.z = v.z;
			}
		}

		mCenter.x = (bmin.x+bmax.x)*0.5f;
		mCenter.y = (bmin.y+bmax.y)*0.5f;
		mCenter.z = (bmin.z+bmax.z)*0.5f;

		HaF32 dx = bmax.x-bmin.x;
		HaF32 dy = bmax.y-bmin.y;
		HaF32 dz = bmax.z-bmin.z;

		if ( dx == 0 )
		{
			mScale.x = 1;
		}
		else
		{
			dx = dx*1.001f;
			mScale.x = dx*0.5f;
		}
		if ( dy == 0 )
		{
			mScale.y = 1;
		}
		else
		{
			dy = dy*1.001f;
			mScale.y = dy*0.5f;
		}
		if ( dz == 0 )
		{
			mScale.z = 1;
		}
		else
		{
			dz = dz*1.001f;
			mScale.z = dz*0.5f;
		}

		Vec3 recip;
		recip.x = 1.0f / mScale.x;
		recip.y = 1.0f / mScale.y;
		recip.z = 1.0f / mScale.z;

		for (HaU32 i=0; i<vcount; i++)
		{
			Vec3 v(&vertices[i*3]);

			v.x = (v.x-mCenter.x)*recip.x;
			v.y = (v.y-mCenter.y)*recip.y;
			v.z = (v.z-mCenter.z)*recip.z;

			HACD_ASSERT( v.x >= -1 && v.x <= 1 );
			HACD_ASSERT( v.y >= -1 && v.y <= 1 );
			HACD_ASSERT( v.z >= -1 && v.z <= 1 );
			mNormalizedInput.push_back(v);
		}
	}